

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NotificationDispatcher.cpp
# Opt level: O1

shared_ptr<Notification> __thiscall
NotificationDispatcher::Find(NotificationDispatcher *this,uint32_t hNotify)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  long lVar2;
  long lVar3;
  uint in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  long lVar4;
  bool bVar5;
  shared_ptr<Notification> sVar6;
  
  __mutex = (pthread_mutex_t *)(CONCAT44(in_register_00000034,hNotify) + 0x70);
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    lVar4 = CONCAT44(in_register_00000034,hNotify) + 0x48;
    lVar2 = lVar4;
    for (lVar3 = *(long *)(CONCAT44(in_register_00000034,hNotify) + 0x50); lVar3 != 0;
        lVar3 = *(long *)(lVar3 + 0x10 + (ulong)bVar5 * 8)) {
      bVar5 = *(uint *)(lVar3 + 0x20) < in_EDX;
      if (!bVar5) {
        lVar2 = lVar3;
      }
    }
    lVar3 = lVar4;
    if ((lVar2 != lVar4) && (lVar3 = lVar2, in_EDX < *(uint *)(lVar2 + 0x20))) {
      lVar3 = lVar4;
    }
    if (lVar3 == lVar4) {
      *(undefined8 *)&(this->deleteNotification).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(this->deleteNotification).super__Function_base._M_functor + 8) = 0;
    }
    else {
      *(undefined8 *)&(this->deleteNotification).super__Function_base._M_functor =
           *(undefined8 *)(lVar3 + 0x28);
      lVar3 = *(long *)(lVar3 + 0x30);
      *(long *)((long)&(this->deleteNotification).super__Function_base._M_functor + 8) = lVar3;
      if (lVar3 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
        }
      }
    }
    pthread_mutex_unlock(__mutex);
    sVar6.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar6.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
    ;
    return (shared_ptr<Notification>)
           sVar6.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

std::shared_ptr<Notification> NotificationDispatcher::Find(uint32_t hNotify)
{
    std::lock_guard<std::recursive_mutex> lock(mutex);
    auto it = notifications.find(hNotify);
    if (it != notifications.end()) {
        return it->second;
    }
    return {};
}